

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_protect.cpp
# Opt level: O3

int __thiscall
anon_unknown.dwarf_2cabdd::mock_region_factory::init(mock_region_factory *this,EVP_PKEY_CTX *ctx)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2> file;
  uint64_t bytes_to_map;
  shared_ptr<pstore::file::in_memory> file_00;
  region_builder<pstore::file::in_memory,_(anonymous_namespace)::mock_mapper> rStack_48;
  not_null<std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_*>
  local_28;
  
  peVar1 = ((__shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2> *)(ctx + 0x18))->
           _M_ptr;
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(ctx + 0x20);
  file = *(__shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2> *)(ctx + 0x18);
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bytes_to_map = peVar1->eof_;
    file_00.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    file_00.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    pstore::region::region_builder<pstore::file::in_memory,_(anonymous_namespace)::mock_mapper>::
    region_builder(&rStack_48,file_00,*(uint64_t *)(ctx + 8),*(uint64_t *)(ctx + 0x10));
    goto LAB_00195a2a;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
    bytes_to_map = peVar1->eof_;
    if (__libc_single_threaded != '\0') goto LAB_00195a0c;
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
    bytes_to_map = peVar1->eof_;
LAB_00195a0c:
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
  pstore::region::region_builder<pstore::file::in_memory,_(anonymous_namespace)::mock_mapper>::
  region_builder(&rStack_48,(shared_ptr<pstore::file::in_memory>)file,*(uint64_t *)(ctx + 8),
                 *(uint64_t *)(ctx + 0x10));
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
LAB_00195a2a:
  (this->super_factory)._vptr_factory = (_func_int **)0x0;
  (this->super_factory).full_size_ = 0;
  (this->super_factory).min_size_ = 0;
  local_28.ptr_ =
       (vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
        *)this;
  pstore::gsl::
  not_null<std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_*>
  ::ensure_invariant(&local_28);
  pstore::region::region_builder<pstore::file::in_memory,_(anonymous_namespace)::mock_mapper>::
  append(&rStack_48,local_28,0,bytes_to_map);
  if (rStack_48.file_.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (rStack_48.file_.
               super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return (int)this;
}

Assistant:

auto init () -> std::vector<pstore::region::memory_mapper_ptr> override {
            return this->create<pstore::file::in_memory, mock_mapper> (file_);
        }